

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__fill_bits(stbi__zbuf *z)

{
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  uVar4 = z->code_buffer;
  iVar5 = z->num_bits;
  do {
    bVar3 = (byte)iVar5 & 0x1f;
    if (uVar4 >> bVar3 != 0) {
      __assert_fail("z->code_buffer < (1U << z->num_bits)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/susonthapa[P]3d-chair/src/stb_image.h"
                    ,0xf24,"void stbi__fill_bits(stbi__zbuf *)");
    }
    pbVar1 = z->zbuffer;
    uVar6 = 0 >> bVar3;
    if (pbVar1 < z->zbuffer_end) {
      z->zbuffer = pbVar1 + 1;
      uVar6 = (uint)*pbVar1;
    }
    uVar4 = uVar4 | uVar6 << ((byte)iVar5 & 0x1f);
    z->code_buffer = uVar4;
    z->num_bits = iVar5 + 8;
    bVar2 = iVar5 < 0x11;
    iVar5 = iVar5 + 8;
  } while (bVar2);
  return;
}

Assistant:

static void stbi__fill_bits(stbi__zbuf *z)
{
   do {
      STBI_ASSERT(z->code_buffer < (1U << z->num_bits));
      z->code_buffer |= (unsigned int) stbi__zget8(z) << z->num_bits;
      z->num_bits += 8;
   } while (z->num_bits <= 24);
}